

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btype.h
# Opt level: O1

Btype __thiscall verona::operator/(verona *this,Btype *b,Token *f)

{
  element_type *node;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  Btype BVar2;
  WFLookup local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  node = (b->super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  trieste::operator/(&local_38,&node->node,f);
  this_00._M_pi =
       local_38.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_38.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_38.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_38.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  BVar2 = BtypeDef::make((BtypeDef *)this,&node->node);
  _Var1 = BVar2.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    _Var1._M_pi = extraout_RDX;
  }
  if (local_38.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  BVar2.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  BVar2.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Btype)BVar2.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline Btype operator/(Btype& b, const Token& f)
  {
    return b->make(b->node / f);
  }